

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O1

char * __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,XMLCh *toTranscode,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  UErrorCode err;
  XMLMutexLock lockConverter;
  ArrayJanitor<char16_t> janTmp;
  int local_4c;
  XMLMutexLock local_48;
  ArrayJanitor<char16_t> local_40;
  char *pcVar3;
  
  if (toTranscode == (XMLCh *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else if (*toTranscode == L'\0') {
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,1);
    pcVar3 = (char *)CONCAT44(extraout_var_01,iVar2);
    *pcVar3 = '\0';
  }
  else {
    lVar5 = 0;
    do {
      psVar1 = (short *)((long)toTranscode + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -1;
    ArrayJanitor<char16_t>::ArrayJanitor(&local_40,(char16_t *)0x0,manager);
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    iVar4 = (int)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 1.25) + 1;
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,(long)iVar4);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
    local_4c = 0;
    XMLMutexLock::XMLMutexLock(&local_48,&this->fMutex);
    iVar2 = ucnv_fromUChars_70(this->fConverter,pcVar3,iVar4,toTranscode,0xffffffff,&local_4c);
    XMLMutexLock::~XMLMutexLock(&local_48);
    if ((local_4c == 0xf) || (local_4c == -0x7c)) {
      local_4c = 0;
      (*manager->_vptr_MemoryManager[4])(manager,pcVar3);
      iVar4 = (*manager->_vptr_MemoryManager[3])(manager,(long)(iVar2 + 1));
      pcVar3 = (char *)CONCAT44(extraout_var_00,iVar4);
      XMLMutexLock::XMLMutexLock(&local_48,&this->fMutex);
      ucnv_fromUChars_70(this->fConverter,pcVar3,iVar2 + 1,toTranscode,0xffffffff,&local_4c);
      XMLMutexLock::~XMLMutexLock(&local_48);
    }
    if (0 < local_4c) {
      (*manager->_vptr_MemoryManager[4])(manager,pcVar3);
      pcVar3 = (char *)0x0;
    }
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  }
  return pcVar3;
}

Assistant:

char* ICULCPTranscoder::transcode(const XMLCh* const toTranscode,
                                  MemoryManager* const manager)
{
    char* retBuf = 0;

    // Check for a couple of special cases
    if (!toTranscode)
        return retBuf;

    if (!*toTranscode)
    {
        retBuf = (char*) manager->allocate(sizeof(char));//new char[1];
        retBuf[0] = 0;
        return retBuf;
    }

    //
    //  Get the length of the source string since we'll have to use it in
    //  a couple places below.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toTranscode);

    //
    //  If XMLCh and UChar are not the same size, then we have to make a
    //  temp copy of the text to pass to ICU.
    //
    const UChar* actualSrc;
    UChar* ncActual = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        actualSrc = (const UChar*)toTranscode;
    }
    else
    {
        // Allocate a non-const temp buf, but store it also in the actual
        ncActual = convertToUChar(toTranscode, 0, manager);
        actualSrc = ncActual;
    }

    // Insure that the temp buffer, if any, gets cleaned up via the nc pointer
    ArrayJanitor<UChar> janTmp(ncActual, manager);

    // Caculate a return buffer size not too big, but less likely to overflow
    int32_t targetLen = (int32_t)(srcLen * 1.25);

    // Allocate the return buffer
    retBuf = (char*) manager->allocate((targetLen + 1) * sizeof(char));//new char[targetLen + 1];

    //
    //  Lock now while we call the converter. Use a faux block to do the
    //  lock so that it unlocks immediately afterwards.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    {
        XMLMutexLock lockConverter(&fMutex);

        targetCap = ucnv_fromUChars
        (
            fConverter
            , retBuf
            , targetLen + 1
            , actualSrc
            , -1
            , &err
        );
    }

    // If targetLen is not enough then buffer overflow might occur
    if ((err == U_BUFFER_OVERFLOW_ERROR) || (err == U_STRING_NOT_TERMINATED_WARNING))
    {
        //
        //  Reset the error, delete the old buffer, allocate a new one,
        //  and try again.
        //
        err = U_ZERO_ERROR;
        manager->deallocate(retBuf);//delete [] retBuf;
        retBuf = (char*) manager->allocate((targetCap + 1) * sizeof(char));//new char[targetCap + 1];

        // Lock again before we retry
        XMLMutexLock lockConverter(&fMutex);
        targetCap = ucnv_fromUChars
        (
            fConverter
            , retBuf
            , targetCap + 1
            , actualSrc
            , -1
            , &err
        );
    }

    if (U_FAILURE(err))
    {
        manager->deallocate(retBuf);//delete [] retBuf;
        return 0;
    }

    return retBuf;
}